

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

pointer __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
create_array<std::initializer_list<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,allocator_type *alloc
          ,initializer_list<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *args)

{
  pointer_conflict __p;
  stor_allocator_type stor_alloc;
  
  __p = std::
        allocator_traits<std::allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>_>_>
        ::allocate(&stor_alloc,1);
  __gnu_cxx::
  new_allocator<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>>
  ::
  construct<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>,std::initializer_list<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&>
            ((new_allocator<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>>
              *)&stor_alloc,__p,args);
  return __p;
}

Assistant:

typename array_storage::pointer create_array(const allocator_type& alloc, Args&& ... args)
        {
            using stor_allocator_type = typename array_storage::allocator_type;
            stor_allocator_type stor_alloc(alloc);
            auto ptr = std::allocator_traits<stor_allocator_type>::allocate(stor_alloc, 1);
            JSONCONS_TRY
            {
                std::allocator_traits<stor_allocator_type>::construct(stor_alloc, ext_traits::to_plain_pointer(ptr), 
                    std::forward<Args>(args)...);
            }